

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

void htmlParseScript(htmlParserCtxtPtr ctxt)

{
  xmlChar *str;
  xmlChar *pxVar1;
  charactersSAXFunc p_Var2;
  _xmlSAXHandler *p_Var3;
  uint val;
  int iVar4;
  cdataBlockSAXFunc p_Var5;
  long lVar6;
  xmlParserInputPtr pxVar7;
  uint uVar8;
  uint uVar9;
  int l;
  xmlChar buf [1005];
  int local_42c;
  xmlChar local_428 [1016];
  
  pxVar7 = ctxt->input;
  lVar6 = (long)pxVar7->cur - (long)pxVar7->base;
  if ((500 < lVar6) && (lVar6 = (long)pxVar7->end - (long)pxVar7->cur, lVar6 < 500)) {
    xmlParserInputShrink(pxVar7);
  }
  val = htmlCurrentChar(ctxt,&local_42c);
  uVar8 = 0;
  do {
    iVar4 = (int)lVar6;
    if (val == 0x3c) {
      pxVar1 = ctxt->input->cur;
      if (pxVar1[1] == '/') {
        if (ctxt->recovery == 0) {
          if ((byte)((pxVar1[2] & 0xdf) + 0xbf) < 0x1a) goto LAB_0015187f;
        }
        else {
          str = ctxt->name;
          iVar4 = xmlStrlen(str);
          iVar4 = xmlStrncasecmp(str,pxVar1 + 2,iVar4);
          if (iVar4 == 0) {
LAB_0015187f:
            if (((uVar8 != 0) && (p_Var3 = ctxt->sax, p_Var3 != (_xmlSAXHandler *)0x0)) &&
               (ctxt->disableSAX == 0)) {
              local_428[(int)uVar8] = '\0';
              p_Var5 = p_Var3->cdataBlock;
              if ((p_Var5 != (cdataBlockSAXFunc)0x0) ||
                 (p_Var5 = p_Var3->characters, p_Var5 != (cdataBlockSAXFunc)0x0)) {
                (*p_Var5)(ctxt->userData,local_428,uVar8);
              }
            }
            return;
          }
          htmlParseErr(ctxt,XML_ERR_TAG_NAME_MISMATCH,"Element %s embeds close tag\n",ctxt->name,
                       (xmlChar *)0x0);
        }
      }
LAB_00151798:
      if (local_42c == 1) {
        uVar9 = uVar8 + 1;
        local_428[(int)uVar8] = (xmlChar)val;
      }
      else {
        iVar4 = xmlCopyChar(local_42c,local_428 + (int)uVar8,val);
        uVar9 = iVar4 + uVar8;
      }
      uVar8 = uVar9;
      if (999 < (int)uVar9) {
        local_428[uVar9] = '\0';
        p_Var5 = ctxt->sax->cdataBlock;
        if (p_Var5 == (cdataBlockSAXFunc)0x0) {
          p_Var2 = ctxt->sax->characters;
          uVar8 = 0;
          if (p_Var2 != (charactersSAXFunc)0x0) {
            (*p_Var2)(ctxt->userData,local_428,uVar9);
          }
        }
        else {
          (*p_Var5)(ctxt->userData,local_428,uVar9);
          uVar8 = 0;
        }
      }
    }
    else {
      if (val == 0) goto LAB_0015187f;
      if ((int)val < 0x100) {
        if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
        goto LAB_00151798;
      }
      else {
        uVar9 = val - 0xe000;
        iVar4 = CONCAT31((int3)(uVar9 >> 8),uVar9 < 0x1ffe || val < 0xd800);
        if (val - 0x10000 < 0x100000 || (uVar9 < 0x1ffe || val < 0xd800)) goto LAB_00151798;
      }
      htmlParseErrInt(ctxt,0x1f656b,(char *)(ulong)val,iVar4);
    }
    pxVar7 = ctxt->input;
    if ((ctxt->progressive == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
      xmlParserInputGrow(pxVar7,0xfa);
      pxVar7 = ctxt->input;
    }
    pxVar1 = pxVar7->cur;
    if (*pxVar1 == '\n') {
      pxVar7->line = pxVar7->line + 1;
      pxVar7->col = 1;
    }
    else {
      pxVar7->col = pxVar7->col + 1;
    }
    ctxt->token = 0;
    lVar6 = (long)local_42c;
    pxVar7->cur = pxVar1 + lVar6;
    val = htmlCurrentChar(ctxt,&local_42c);
  } while( true );
}

Assistant:

static void
htmlParseScript(htmlParserCtxtPtr ctxt) {
    xmlChar buf[HTML_PARSER_BIG_BUFFER_SIZE + 5];
    int nbchar = 0;
    int cur,l;

    SHRINK;
    cur = CUR_CHAR(l);
    while (cur != 0) {
	if ((cur == '<') && (NXT(1) == '/')) {
            /*
             * One should break here, the specification is clear:
             * Authors should therefore escape "</" within the content.
             * Escape mechanisms are specific to each scripting or
             * style sheet language.
             *
             * In recovery mode, only break if end tag match the
             * current tag, effectively ignoring all tags inside the
             * script/style block and treating the entire block as
             * CDATA.
             */
            if (ctxt->recovery) {
                if (xmlStrncasecmp(ctxt->name, ctxt->input->cur+2,
				   xmlStrlen(ctxt->name)) == 0)
                {
                    break; /* while */
                } else {
		    htmlParseErr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
				 "Element %s embeds close tag\n",
		                 ctxt->name, NULL);
		}
            } else {
                if (((NXT(2) >= 'A') && (NXT(2) <= 'Z')) ||
                    ((NXT(2) >= 'a') && (NXT(2) <= 'z')))
                {
                    break; /* while */
                }
            }
	}
        if (IS_CHAR(cur)) {
	    COPY_BUF(l,buf,nbchar,cur);
        } else {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Invalid char in CDATA 0x%X\n", cur);
        }
	if (nbchar >= HTML_PARSER_BIG_BUFFER_SIZE) {
            buf[nbchar] = 0;
	    if (ctxt->sax->cdataBlock!= NULL) {
		/*
		 * Insert as CDATA, which is the same as HTML_PRESERVE_NODE
		 */
		ctxt->sax->cdataBlock(ctxt->userData, buf, nbchar);
	    } else if (ctxt->sax->characters != NULL) {
		ctxt->sax->characters(ctxt->userData, buf, nbchar);
	    }
	    nbchar = 0;
	}
	GROW;
	NEXTL(l);
	cur = CUR_CHAR(l);
    }

    if ((nbchar != 0) && (ctxt->sax != NULL) && (!ctxt->disableSAX)) {
        buf[nbchar] = 0;
	if (ctxt->sax->cdataBlock!= NULL) {
	    /*
	     * Insert as CDATA, which is the same as HTML_PRESERVE_NODE
	     */
	    ctxt->sax->cdataBlock(ctxt->userData, buf, nbchar);
	} else if (ctxt->sax->characters != NULL) {
	    ctxt->sax->characters(ctxt->userData, buf, nbchar);
	}
    }
}